

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.hpp
# Opt level: O2

void __thiscall antlr::TreeParser::matchNot(TreeParser *this,RefAST *t,int ttype)

{
  AST *pAVar1;
  int iVar2;
  int numTokens_;
  MismatchedTokenException *this_00;
  undefined4 extraout_var;
  RefAST local_30;
  
  if (((t->ref != (ASTRef *)0x0) && (pAVar1 = t->ref->ptr, pAVar1 != (AST *)0x0)) &&
     ((ASTNULL == (long *)0x0 || (pAVar1 != (AST *)*ASTNULL)))) {
    iVar2 = (*pAVar1->_vptr_AST[0x10])();
    if (iVar2 != ttype) {
      return;
    }
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(200);
  iVar2 = (*this->_vptr_TreeParser[8])(this);
  numTokens_ = (*this->_vptr_TreeParser[7])(this);
  local_30 = (RefAST)t->ref;
  if (local_30.ref != (ASTRef *)0x0) {
    (local_30.ref)->count = (local_30.ref)->count + 1;
  }
  MismatchedTokenException::MismatchedTokenException
            (this_00,(char **)CONCAT44(extraout_var,iVar2),numTokens_,&local_30,ttype,true);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void matchNot(RefAST t, int ttype)
	{
		if ( !t || t == ASTNULL || t->getType() == ttype )
			throw MismatchedTokenException( getTokenNames(), getNumTokens(),
													  t, ttype, true );
	}